

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O2

void __thiscall
dg::pta::LLVMPointerGraphBuilder::PSNodesBlock::append(PSNodesBlock *this,PSNodesSeq *s)

{
  PSNodesSeq *local_8;
  
  local_8 = s;
  std::
  vector<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*,_std::allocator<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*>_>
  ::push_back(&this->_nodes,&local_8);
  return;
}

Assistant:

void append(PSNodesSeq *s) { _nodes.push_back(s); }